

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O3

void Cec2_ManPrintStats(Gia_Man_t *p,Cec2_Par_t *pPars,Cec2_Man_t *pMan)

{
  uint uVar1;
  
  if (pPars->fVerbose != 0) {
    if (pMan == (Cec2_Man_t *)0x0) {
      uVar1 = 0;
      printf("S =%5d ",0);
      printf("U =%5d ",0);
    }
    else {
      printf("S =%5d ",(ulong)(uint)pMan->nSatSat);
      printf("U =%5d ",(ulong)(uint)pMan->nSatUnsat);
      uVar1 = pMan->nSatUndec;
    }
    printf("F =%5d ",(ulong)uVar1);
    Gia_ManEquivPrintClasses(p,pPars->fVeryVerbose,0.0);
    return;
  }
  return;
}

Assistant:

void Cec2_ManPrintStats( Gia_Man_t * p, Cec2_Par_t * pPars, Cec2_Man_t * pMan )
{
    if ( !pPars->fVerbose )
        return;
    printf( "S =%5d ", pMan ? pMan->nSatSat   : 0 );
    printf( "U =%5d ", pMan ? pMan->nSatUnsat : 0 );
    printf( "F =%5d ", pMan ? pMan->nSatUndec : 0 );
    Gia_ManEquivPrintClasses( p, pPars->fVeryVerbose, 0 );
}